

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

Value * resizearray(lua_State *L,Table *t,uint oldasize,uint newasize)

{
  Value *pVVar1;
  size_t sVar2;
  void *pvVar3;
  size_t local_80;
  size_t tomoveb;
  uint tomove;
  Value *op_1;
  size_t oldasizeb;
  Value *np;
  size_t newasizeb;
  Value *op;
  uint newasize_local;
  uint oldasize_local;
  Table *t_local;
  lua_State *L_local;
  
  if (oldasize == newasize) {
    L_local = (lua_State *)t->array;
  }
  else if (newasize == 0) {
    pVVar1 = t->array;
    sVar2 = concretesize(oldasize);
    luaM_free_(L,pVVar1 + -(ulong)oldasize,sVar2);
    L_local = (lua_State *)0x0;
  }
  else {
    local_80 = concretesize(newasize);
    pvVar3 = luaM_realloc_(L,(void *)0x0,0,local_80);
    if (pvVar3 == (void *)0x0) {
      L_local = (lua_State *)0x0;
    }
    else {
      L_local = (lua_State *)((long)pvVar3 + (ulong)newasize * 8);
      if (oldasize != 0) {
        sVar2 = concretesize(oldasize);
        pVVar1 = t->array;
        if (oldasize < newasize) {
          local_80 = sVar2;
          newasize = oldasize;
        }
        memcpy((void *)((long)L_local + (ulong)newasize * -8),pVVar1 + -(ulong)newasize,local_80);
        luaM_free_(L,pVVar1 + -(ulong)oldasize,sVar2);
      }
    }
  }
  return (Value *)L_local;
}

Assistant:

static Value *resizearray (lua_State *L , Table *t,
                               unsigned oldasize,
                               unsigned newasize) {
  if (oldasize == newasize)
    return t->array;  /* nothing to be done */
  else if (newasize == 0) {  /* erasing array? */
    Value *op = t->array - oldasize;  /* original array's real address */
    luaM_freemem(L, op, concretesize(oldasize));  /* free it */
    return NULL;
  }
  else {
    size_t newasizeb = concretesize(newasize);
    Value *np = cast(Value *,
                  luaM_reallocvector(L, NULL, 0, newasizeb, lu_byte));
    if (np == NULL)  /* allocation error? */
      return NULL;
    np += newasize;  /* shift pointer to the end of value segment */
    if (oldasize > 0) {
      /* move common elements to new position */
      size_t oldasizeb = concretesize(oldasize);
      Value *op = t->array;  /* original array */
      unsigned tomove = (oldasize < newasize) ? oldasize : newasize;
      size_t tomoveb = (oldasize < newasize) ? oldasizeb : newasizeb;
      lua_assert(tomoveb > 0);
      memcpy(np - tomove, op - tomove, tomoveb);
      luaM_freemem(L, op - oldasize, oldasizeb);  /* free old block */
    }
    return np;
  }
}